

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.h
# Opt level: O2

void hydro_x25519_sc_montmul(hydro_x25519_limb_t *out,hydro_x25519_limb_t *a,hydro_x25519_limb_t *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  
  uVar13 = 0;
  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
    uVar15 = 0xd2b51da312547e1b;
    uVar17 = 0;
    uVar11 = a[lVar16];
    uVar10 = 0;
    for (lVar18 = 0; lVar18 != 0x20; lVar18 = lVar18 + 8) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar11;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)((long)b + lVar18);
      auVar7[8] = CARRY8(uVar10,*(ulong *)((long)out + lVar18));
      auVar7._0_8_ = uVar10 + *(ulong *)((long)out + lVar18);
      auVar7._9_7_ = 0;
      auVar7 = auVar1 * auVar4 + auVar7;
      uVar14 = auVar7._0_8_;
      uVar10 = auVar7._8_8_;
      uVar12 = 1;
      if (lVar18 == 0) {
        uVar12 = uVar14;
      }
      uVar15 = uVar15 * uVar12;
      auVar8[8] = CARRY8(uVar14,uVar17);
      auVar8._0_8_ = uVar14 + uVar17;
      auVar8._9_7_ = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar15;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)((long)hydro_x25519_sc_p + lVar18);
      auVar8 = auVar2 * auVar5 + auVar8;
      uVar17 = auVar8._8_8_;
      if (lVar18 != 0) {
        *(long *)((long)out + lVar18 + -8) = auVar8._0_8_;
      }
    }
    uVar11 = uVar10 + uVar13;
    uVar13 = (ulong)CARRY8(uVar10,uVar13) + (ulong)CARRY8(uVar11,uVar17);
    out[3] = uVar11 + uVar17;
  }
  uVar11 = 0;
  lVar18 = 0;
  for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 8) {
    uVar10 = uVar11 + *(ulong *)((long)out + lVar16);
    uVar11 = (lVar18 + (ulong)CARRY8(uVar11,*(ulong *)((long)out + lVar16))) -
             (ulong)(uVar10 < *(ulong *)((long)hydro_x25519_sc_p + lVar16));
    *(ulong *)((long)out + lVar16) = uVar10 - *(ulong *)((long)hydro_x25519_sc_p + lVar16);
    lVar18 = (long)uVar11 >> 0x3f;
  }
  uVar10 = 0;
  for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 8) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = -(uVar13 + uVar11);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)((long)hydro_x25519_sc_p + lVar16);
    auVar9[8] = CARRY8(uVar10,*(ulong *)((long)out + lVar16));
    auVar9._0_8_ = uVar10 + *(ulong *)((long)out + lVar16);
    auVar9._9_7_ = 0;
    auVar9 = auVar3 * auVar6 + auVar9;
    uVar10 = auVar9._8_8_;
    *(long *)((long)out + lVar16) = auVar9._0_8_;
  }
  return;
}

Assistant:

static void
hydro_x25519_sc_montmul(hydro_x25519_scalar_t out, const hydro_x25519_scalar_t a,
                        const hydro_x25519_scalar_t b)
{
    hydro_x25519_limb_t hic = 0;
    int                 i, j;

    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        hydro_x25519_limb_t carry = 0, carry2 = 0, mand = a[i],
                            mand2 = hydro_x25519_MONTGOMERY_FACTOR;

        for (j = 0; j < hydro_x25519_NLIMBS; j++) {
            hydro_x25519_limb_t acc = out[j];

            acc = hydro_x25519_umaal(&carry, acc, mand, b[j]);
            if (j == 0) {
                mand2 *= acc;
            }
            acc = hydro_x25519_umaal(&carry2, acc, mand2, hydro_x25519_sc_p[j]);
            if (j > 0) {
                out[j - 1] = acc;
            }
        }

        /* Add two carry registers and high carry */
        out[hydro_x25519_NLIMBS - 1] = hydro_x25519_adc(&hic, carry, carry2);
    }

    /* Reduce */
    hydro_x25519_sdlimb_t scarry = 0;
    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        out[i] = (hydro_x25519_limb_t) (scarry = scarry + out[i] - hydro_x25519_sc_p[i]);
        scarry >>= hydro_x25519_WBITS;
    }
    hydro_x25519_limb_t need_add = (hydro_x25519_limb_t) - (scarry + hic);

    hydro_x25519_limb_t carry = 0;
    for (i = 0; i < hydro_x25519_NLIMBS; i++) {
        out[i] = hydro_x25519_umaal(&carry, out[i], need_add, hydro_x25519_sc_p[i]);
    }
}